

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_15::BinaryReaderObjdump::EndInitExpr(BinaryReaderObjdump *this)

{
  InitExprType IVar1;
  pointer pIVar2;
  ulong uVar3;
  
  if (this->reading_data_init_expr_ == true) {
    this->reading_data_init_expr_ = false;
    pIVar2 = (this->current_init_expr_).insts.
             super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->current_init_expr_).insts.
              super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 == 0x18) {
      IVar1 = (this->current_init_expr_).type;
      if (IVar1 == I64) {
        uVar3 = (pIVar2->imm).i64;
      }
      else {
        if (IVar1 != I32) {
          return (Result)Ok;
        }
        uVar3 = (ulong)(pIVar2->imm).index;
      }
      this->data_offset_ = uVar3;
    }
  }
  else if (this->reading_elem_init_expr_ == true) {
    this->reading_elem_init_expr_ = false;
    pIVar2 = (this->current_init_expr_).insts.
             super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->current_init_expr_).insts.
              super__Vector_base<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 == 0x18) {
      IVar1 = (this->current_init_expr_).type;
      if (IVar1 == I64) {
        uVar3 = (pIVar2->imm).i64;
      }
      else {
        if (IVar1 != I32) {
          return (Result)Ok;
        }
        uVar3 = (ulong)(pIVar2->imm).index;
      }
      this->elem_offset_ = uVar3;
    }
  }
  else {
    if (this->reading_global_init_expr_ != true) {
      abort();
    }
    this->reading_global_init_expr_ = false;
    PrintInitExpr(this,&this->current_init_expr_,false);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::EndInitExpr() {
  if (reading_data_init_expr_) {
    reading_data_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &data_offset_);
  } else if (reading_elem_init_expr_) {
    reading_elem_init_expr_ = false;
    InitExprToConstOffset(current_init_expr_, &elem_offset_);
  } else if (reading_global_init_expr_) {
    reading_global_init_expr_ = false;
    PrintInitExpr(current_init_expr_);
  } else {
    WABT_UNREACHABLE;
  }
  return Result::Ok;
}